

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  RayHitK<4> *pRVar5;
  undefined8 uVar6;
  Scene *pSVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  byte bVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  RayHitK<4> *pRVar35;
  long lVar36;
  long lVar37;
  Scene *pSVar38;
  ulong uVar40;
  ulong uVar41;
  uint *puVar42;
  ulong uVar43;
  long lVar44;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar45;
  RayHitK<4> *pRVar46;
  ulong uVar47;
  float fVar48;
  uint uVar49;
  float fVar67;
  float fVar70;
  vint4 bi;
  uint uVar68;
  uint uVar71;
  float fVar72;
  uint uVar73;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar69;
  float fVar74;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar66;
  float fVar75;
  int iVar86;
  int iVar90;
  vint4 bi_1;
  float fVar76;
  float fVar77;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar91;
  float fVar92;
  int iVar93;
  float fVar94;
  float fVar95;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar96;
  float fVar98;
  float fVar103;
  float fVar106;
  vint4 ai;
  uint uVar97;
  uint uVar104;
  uint uVar107;
  float fVar111;
  uint uVar112;
  undefined1 auVar99 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar100;
  float fVar105;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar113;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar123;
  float fVar128;
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar129;
  float fVar131;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar132;
  float fVar133;
  float fVar140;
  float fVar142;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar138;
  float fVar141;
  float fVar143;
  undefined1 auVar139 [16];
  float fVar144;
  float fVar149;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  float fVar151;
  float fVar152;
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar153 [16];
  float fVar156;
  undefined1 auVar154 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  int iVar186;
  float fVar187;
  int iVar188;
  float fVar189;
  int iVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined8 local_1328;
  undefined8 uStack_1320;
  float fStack_1314;
  vbool<4> valid;
  undefined1 local_12e8 [8];
  undefined8 uStack_12e0;
  undefined1 local_12d8 [8];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12a8 [16];
  undefined4 local_1298;
  undefined4 uStack_1294;
  float fStack_1290;
  float fStack_128c;
  uint *local_1288;
  float fStack_1280;
  float fStack_127c;
  undefined1 local_1278 [8];
  float fStack_1270;
  float fStack_126c;
  RTCFilterFunctionNArguments args;
  undefined8 uStack_1230;
  float fStack_11f0;
  float fStack_11ec;
  vfloat<4> tNear;
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  int local_10c8;
  int iStack_10c4;
  int iStack_10c0;
  int iStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined4 local_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 local_1028;
  undefined4 uStack_1024;
  undefined4 uStack_1020;
  undefined4 uStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar39;
  
  pSVar45 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar77 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar113 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar110 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar173 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar32 = (tray->tnear).field_0.i[k];
  iVar31 = (tray->tfar).field_0.i[k];
  local_fc8 = mm_lookupmask_ps._0_8_;
  uStack_fc0 = mm_lookupmask_ps._8_8_;
  local_fd8 = mm_lookupmask_ps._240_8_;
  uStack_fd0 = mm_lookupmask_ps._248_8_;
  local_fb8 = fVar77;
  fStack_fb4 = fVar77;
  fStack_fb0 = fVar77;
  fStack_fac = fVar77;
  local_1078 = fVar113;
  fStack_1074 = fVar113;
  fStack_1070 = fVar113;
  fStack_106c = fVar113;
  local_1088 = fVar110;
  fStack_1084 = fVar110;
  fStack_1080 = fVar110;
  fStack_107c = fVar110;
  local_1098 = fVar89;
  fStack_1094 = fVar89;
  fStack_1090 = fVar89;
  fStack_108c = fVar89;
  local_10a8 = fVar98;
  fStack_10a4 = fVar98;
  fStack_10a0 = fVar98;
  fStack_109c = fVar98;
  local_10b8 = fVar173;
  fStack_10b4 = fVar173;
  fStack_10b0 = fVar173;
  fStack_10ac = fVar173;
  local_10c8 = iVar32;
  iStack_10c4 = iVar32;
  iStack_10c0 = iVar32;
  iStack_10bc = iVar32;
  fVar144 = fVar113;
  fVar177 = fVar113;
  fVar178 = fVar113;
  fVar92 = fVar110;
  fVar133 = fVar110;
  fVar76 = fVar110;
  fVar105 = fVar98;
  fVar174 = fVar98;
  fVar149 = fVar98;
  fVar180 = fVar173;
  fVar181 = fVar173;
  fVar109 = fVar173;
  iVar186 = iVar32;
  iVar188 = iVar32;
  iVar190 = iVar32;
  iVar86 = iVar31;
  iVar90 = iVar31;
  iVar93 = iVar31;
  fVar152 = fVar77;
  fVar156 = fVar77;
  fVar141 = fVar77;
  fVar88 = fVar89;
  fVar108 = fVar89;
  fVar175 = fVar89;
LAB_007088b5:
  do {
    do {
      if (pSVar45 == stack) {
        return;
      }
      pSVar28 = pSVar45 + -1;
      pSVar45 = pSVar45 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar28->dist &&
             (float)pSVar28->dist != *(float *)(ray + k * 4 + 0x80));
    pRVar35 = ray;
    pRVar46 = (RayHitK<4> *)(pSVar45->ptr).ptr;
    while (((ulong)pRVar46 & 8) == 0) {
      pRVar5 = pRVar46 + uVar43 + 0x20;
      fVar48 = (*(float *)pRVar5 - fVar77) * fVar89;
      fVar67 = (*(float *)(pRVar5 + 4) - fVar152) * fVar88;
      fVar70 = (*(float *)(pRVar5 + 8) - fVar156) * fVar108;
      fVar72 = (*(float *)(pRVar5 + 0xc) - fVar141) * fVar175;
      pRVar5 = pRVar46 + uVar41 + 0x20;
      fVar96 = (*(float *)pRVar5 - fVar113) * fVar98;
      fVar103 = (*(float *)(pRVar5 + 4) - fVar144) * fVar105;
      fVar106 = (*(float *)(pRVar5 + 8) - fVar177) * fVar174;
      fVar111 = (*(float *)(pRVar5 + 0xc) - fVar178) * fVar149;
      uVar97 = (uint)((int)fVar96 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar96 >= (int)fVar48) * (int)fVar96;
      uVar104 = (uint)((int)fVar103 < (int)fVar67) * (int)fVar67 |
                (uint)((int)fVar103 >= (int)fVar67) * (int)fVar103;
      uVar107 = (uint)((int)fVar106 < (int)fVar70) * (int)fVar70 |
                (uint)((int)fVar106 >= (int)fVar70) * (int)fVar106;
      uVar112 = (uint)((int)fVar111 < (int)fVar72) * (int)fVar72 |
                (uint)((int)fVar111 >= (int)fVar72) * (int)fVar111;
      pRVar5 = pRVar46 + uVar40 + 0x20;
      fVar48 = (*(float *)pRVar5 - fVar110) * fVar173;
      fVar67 = (*(float *)(pRVar5 + 4) - fVar92) * fVar180;
      fVar70 = (*(float *)(pRVar5 + 8) - fVar133) * fVar181;
      fVar72 = (*(float *)(pRVar5 + 0xc) - fVar76) * fVar109;
      uVar49 = (uint)((int)fVar48 < iVar32) * iVar32 | (uint)((int)fVar48 >= iVar32) * (int)fVar48;
      uVar68 = (uint)((int)fVar67 < iVar186) * iVar186 |
               (uint)((int)fVar67 >= iVar186) * (int)fVar67;
      uVar71 = (uint)((int)fVar70 < iVar188) * iVar188 |
               (uint)((int)fVar70 >= iVar188) * (int)fVar70;
      uVar73 = (uint)((int)fVar72 < iVar190) * iVar190 |
               (uint)((int)fVar72 >= iVar190) * (int)fVar72;
      tNear.field_0.i[0] =
           ((int)uVar49 < (int)uVar97) * uVar97 | ((int)uVar49 >= (int)uVar97) * uVar49;
      tNear.field_0.i[1] =
           ((int)uVar68 < (int)uVar104) * uVar104 | ((int)uVar68 >= (int)uVar104) * uVar68;
      tNear.field_0.i[2] =
           ((int)uVar71 < (int)uVar107) * uVar107 | ((int)uVar71 >= (int)uVar107) * uVar71;
      tNear.field_0.i[3] =
           ((int)uVar73 < (int)uVar112) * uVar112 | ((int)uVar73 >= (int)uVar112) * uVar73;
      pRVar5 = pRVar46 + (uVar43 ^ 0x10) + 0x20;
      fVar48 = (*(float *)pRVar5 - fVar77) * fVar89;
      fVar67 = (*(float *)(pRVar5 + 4) - fVar152) * fVar88;
      fVar70 = (*(float *)(pRVar5 + 8) - fVar156) * fVar108;
      fVar72 = (*(float *)(pRVar5 + 0xc) - fVar141) * fVar175;
      pRVar5 = pRVar46 + (uVar41 ^ 0x10) + 0x20;
      fVar96 = (*(float *)pRVar5 - fVar113) * fVar98;
      fVar103 = (*(float *)(pRVar5 + 4) - fVar144) * fVar105;
      fVar106 = (*(float *)(pRVar5 + 8) - fVar177) * fVar174;
      fVar111 = (*(float *)(pRVar5 + 0xc) - fVar178) * fVar149;
      uVar97 = (uint)((int)fVar48 < (int)fVar96) * (int)fVar48 |
               (uint)((int)fVar48 >= (int)fVar96) * (int)fVar96;
      uVar104 = (uint)((int)fVar67 < (int)fVar103) * (int)fVar67 |
                (uint)((int)fVar67 >= (int)fVar103) * (int)fVar103;
      uVar107 = (uint)((int)fVar70 < (int)fVar106) * (int)fVar70 |
                (uint)((int)fVar70 >= (int)fVar106) * (int)fVar106;
      uVar112 = (uint)((int)fVar72 < (int)fVar111) * (int)fVar72 |
                (uint)((int)fVar72 >= (int)fVar111) * (int)fVar111;
      pRVar5 = pRVar46 + (uVar40 ^ 0x10) + 0x20;
      fVar48 = (*(float *)pRVar5 - fVar110) * fVar173;
      fVar67 = (*(float *)(pRVar5 + 4) - fVar92) * fVar180;
      fVar70 = (*(float *)(pRVar5 + 8) - fVar133) * fVar181;
      fVar72 = (*(float *)(pRVar5 + 0xc) - fVar76) * fVar109;
      uVar49 = (uint)(iVar31 < (int)fVar48) * iVar31 | (uint)(iVar31 >= (int)fVar48) * (int)fVar48;
      uVar68 = (uint)(iVar86 < (int)fVar67) * iVar86 | (uint)(iVar86 >= (int)fVar67) * (int)fVar67;
      uVar71 = (uint)(iVar90 < (int)fVar70) * iVar90 | (uint)(iVar90 >= (int)fVar70) * (int)fVar70;
      uVar73 = (uint)(iVar93 < (int)fVar72) * iVar93 | (uint)(iVar93 >= (int)fVar72) * (int)fVar72;
      auVar99._0_4_ =
           -(uint)((int)(((int)uVar97 < (int)uVar49) * uVar97 |
                        ((int)uVar97 >= (int)uVar49) * uVar49) < tNear.field_0.i[0]);
      auVar99._4_4_ =
           -(uint)((int)(((int)uVar104 < (int)uVar68) * uVar104 |
                        ((int)uVar104 >= (int)uVar68) * uVar68) < tNear.field_0.i[1]);
      auVar99._8_4_ =
           -(uint)((int)(((int)uVar107 < (int)uVar71) * uVar107 |
                        ((int)uVar107 >= (int)uVar71) * uVar71) < tNear.field_0.i[2]);
      auVar99._12_4_ =
           -(uint)((int)(((int)uVar112 < (int)uVar73) * uVar112 |
                        ((int)uVar112 >= (int)uVar73) * uVar73) < tNear.field_0.i[3]);
      iVar30 = movmskps((int)pRVar35,auVar99);
      if (iVar30 == 0xf) goto LAB_007088b5;
      bVar29 = (byte)iVar30 ^ 0xf;
      uVar47 = (ulong)pRVar46 & 0xfffffffffffffff0;
      lVar37 = 0;
      if (bVar29 != 0) {
        for (; (bVar29 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
        }
      }
      pRVar35 = *(RayHitK<4> **)(uVar47 + lVar37 * 8);
      uVar49 = bVar29 - 1 & (uint)bVar29;
      pRVar46 = pRVar35;
      if (uVar49 != 0) {
        uVar68 = tNear.field_0.i[lVar37];
        lVar37 = 0;
        if (uVar49 != 0) {
          for (; (uVar49 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
          }
        }
        pRVar46 = *(RayHitK<4> **)(uVar47 + lVar37 * 8);
        uVar71 = tNear.field_0.i[lVar37];
        uVar49 = uVar49 - 1 & uVar49;
        if (uVar49 == 0) {
          if (uVar68 < uVar71) {
            (pSVar45->ptr).ptr = (size_t)pRVar46;
            pSVar45->dist = uVar71;
            pSVar45 = pSVar45 + 1;
            pRVar46 = pRVar35;
          }
          else {
            (pSVar45->ptr).ptr = (size_t)pRVar35;
            pSVar45->dist = uVar68;
            pRVar35 = pRVar46;
            pSVar45 = pSVar45 + 1;
          }
        }
        else {
          auVar125._8_4_ = uVar68;
          auVar125._0_8_ = pRVar35;
          auVar125._12_4_ = 0;
          auVar136._8_4_ = uVar71;
          auVar136._0_8_ = pRVar46;
          auVar136._12_4_ = 0;
          lVar37 = 0;
          if (uVar49 != 0) {
            for (; (uVar49 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
            }
          }
          uVar6 = *(undefined8 *)(uVar47 + lVar37 * 8);
          iVar30 = tNear.field_0.i[lVar37];
          auVar146._8_4_ = iVar30;
          auVar146._0_8_ = uVar6;
          auVar146._12_4_ = 0;
          auVar137._8_4_ = -(uint)((int)uVar68 < (int)uVar71);
          uVar49 = uVar49 - 1 & uVar49;
          if (uVar49 == 0) {
            auVar137._4_4_ = auVar137._8_4_;
            auVar137._0_4_ = auVar137._8_4_;
            auVar137._12_4_ = auVar137._8_4_;
            auVar134._8_4_ = uVar71;
            auVar134._0_8_ = pRVar46;
            auVar134._12_4_ = 0;
            auVar135 = blendvps(auVar134,auVar125,auVar137);
            auVar99 = blendvps(auVar125,auVar136,auVar137);
            auVar50._8_4_ = -(uint)(auVar135._8_4_ < iVar30);
            auVar50._4_4_ = auVar50._8_4_;
            auVar50._0_4_ = auVar50._8_4_;
            auVar50._12_4_ = auVar50._8_4_;
            auVar124._8_4_ = iVar30;
            auVar124._0_8_ = uVar6;
            auVar124._12_4_ = 0;
            auVar125 = blendvps(auVar124,auVar135,auVar50);
            auVar136 = blendvps(auVar135,auVar146,auVar50);
            auVar51._8_4_ = -(uint)(auVar99._8_4_ < auVar136._8_4_);
            auVar51._4_4_ = auVar51._8_4_;
            auVar51._0_4_ = auVar51._8_4_;
            auVar51._12_4_ = auVar51._8_4_;
            SVar114 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar136,auVar99,auVar51);
            SVar100 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar99,auVar136,auVar51);
            *pSVar45 = SVar100;
            pSVar45[1] = SVar114;
            pRVar35 = auVar125._0_8_;
            pSVar45 = pSVar45 + 2;
            pRVar46 = pRVar35;
          }
          else {
            lVar37 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
              }
            }
            auVar135._4_4_ = auVar137._8_4_;
            auVar135._0_4_ = auVar137._8_4_;
            auVar135._8_4_ = auVar137._8_4_;
            auVar135._12_4_ = auVar137._8_4_;
            auVar137 = blendvps(auVar136,auVar125,auVar135);
            auVar99 = blendvps(auVar125,auVar136,auVar135);
            auVar145._8_4_ = tNear.field_0.i[lVar37];
            auVar145._0_8_ = *(undefined8 *)(uVar47 + lVar37 * 8);
            auVar145._12_4_ = 0;
            auVar52._8_4_ = -(uint)(iVar30 < tNear.field_0.i[lVar37]);
            auVar52._4_4_ = auVar52._8_4_;
            auVar52._0_4_ = auVar52._8_4_;
            auVar52._12_4_ = auVar52._8_4_;
            auVar136 = blendvps(auVar145,auVar146,auVar52);
            auVar125 = blendvps(auVar146,auVar145,auVar52);
            auVar53._8_4_ = -(uint)(auVar99._8_4_ < auVar125._8_4_);
            auVar53._4_4_ = auVar53._8_4_;
            auVar53._0_4_ = auVar53._8_4_;
            auVar53._12_4_ = auVar53._8_4_;
            auVar146 = blendvps(auVar125,auVar99,auVar53);
            SVar100 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar99,auVar125,auVar53);
            auVar54._8_4_ = -(uint)(auVar137._8_4_ < auVar136._8_4_);
            auVar54._4_4_ = auVar54._8_4_;
            auVar54._0_4_ = auVar54._8_4_;
            auVar54._12_4_ = auVar54._8_4_;
            auVar99 = blendvps(auVar136,auVar137,auVar54);
            auVar125 = blendvps(auVar137,auVar136,auVar54);
            auVar55._8_4_ = -(uint)(auVar125._8_4_ < auVar146._8_4_);
            auVar55._4_4_ = auVar55._8_4_;
            auVar55._0_4_ = auVar55._8_4_;
            auVar55._12_4_ = auVar55._8_4_;
            SVar114 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar125,auVar55);
            SVar138 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar125,auVar146,auVar55);
            *pSVar45 = SVar100;
            pSVar45[1] = SVar138;
            pSVar45[2] = SVar114;
            pRVar35 = auVar99._0_8_;
            pSVar45 = pSVar45 + 3;
            pRVar46 = pRVar35;
          }
        }
      }
    }
    for (lVar37 = 0; lVar37 != (ulong)((uint)pRVar46 & 0xf) - 8; lVar37 = lVar37 + 1) {
      lVar36 = lVar37 * 0x60;
      pSVar7 = context->scene;
      puVar1 = (uint *)(((ulong)pRVar46 & 0xfffffffffffffff0) + lVar36);
      puVar42 = puVar1 + 0x10;
      ppfVar8 = (pSVar7->vertices).items;
      pfVar9 = ppfVar8[*puVar42];
      pfVar2 = pfVar9 + *puVar1;
      fVar98 = *pfVar2;
      fVar173 = pfVar2[1];
      fVar144 = pfVar2[2];
      pfVar2 = pfVar9 + puVar1[4];
      fVar177 = *pfVar2;
      fVar178 = pfVar2[2];
      fVar92 = pfVar9[puVar1[8]];
      fVar152 = (pfVar9 + puVar1[8])[1];
      pfVar9 = pfVar9 + puVar1[0xc];
      fVar133 = *pfVar9;
      fVar76 = pfVar9[2];
      pfVar10 = ppfVar8[puVar1[0x11]];
      pfVar3 = pfVar10 + puVar1[1];
      fVar105 = *pfVar3;
      fVar174 = pfVar3[1];
      fVar149 = pfVar3[2];
      pfVar3 = pfVar10 + puVar1[5];
      fVar180 = *pfVar3;
      fVar181 = pfVar3[2];
      fVar109 = pfVar10[puVar1[9]];
      fVar156 = (pfVar10 + puVar1[9])[1];
      pfVar10 = pfVar10 + puVar1[0xd];
      fVar141 = *pfVar10;
      fVar88 = pfVar10[2];
      pfVar11 = ppfVar8[puVar1[0x12]];
      pfVar4 = pfVar11 + puVar1[2];
      fVar108 = *pfVar4;
      fVar175 = pfVar4[1];
      fVar48 = pfVar4[2];
      fVar67 = pfVar11[(ulong)puVar1[6] + 2];
      uVar6 = *(undefined8 *)(pfVar11 + puVar1[10]);
      uVar26 = *(undefined8 *)(pfVar11 + puVar1[10] + 2);
      uVar27 = *(undefined8 *)(pfVar11 + puVar1[0xe]);
      pfVar12 = ppfVar8[puVar1[0x13]];
      pfVar4 = pfVar12 + puVar1[3];
      fVar70 = *pfVar4;
      fVar72 = pfVar4[1];
      fVar96 = pfVar4[2];
      fVar103 = pfVar12[(ulong)puVar1[7] + 2];
      fVar106 = pfVar12[puVar1[0xb]];
      fVar111 = (pfVar12 + puVar1[0xb])[1];
      pfVar4 = pfVar12 + puVar1[0xf];
      fVar69 = *pfVar4;
      fVar74 = pfVar4[1];
      fVar95 = pfVar4[2];
      fStack_12c4 = (float)((ulong)uVar6 >> 0x20);
      fVar164 = (float)uVar6;
      local_1328._0_4_ = (float)uVar27;
      local_1328._4_4_ = (float)((ulong)uVar27 >> 0x20);
      uStack_1320._0_4_ = (float)*(undefined8 *)(pfVar11 + puVar1[0xe] + 2);
      local_f88 = pfVar2[1];
      fStack_f84 = pfVar3[1];
      fStack_f80 = pfVar11[(ulong)puVar1[6] + 1];
      fStack_f7c = pfVar12[(ulong)puVar1[7] + 1];
      fVar132 = fVar173 - pfVar2[1];
      fVar140 = fVar174 - pfVar3[1];
      fVar142 = fVar175 - pfVar11[(ulong)puVar1[6] + 1];
      fVar143 = fVar72 - pfVar12[(ulong)puVar1[7] + 1];
      fVar159 = fVar144 - fVar178;
      fVar160 = fVar149 - fVar181;
      fVar161 = fVar48 - fVar67;
      fVar162 = fVar96 - fVar103;
      fVar176 = pfVar9[1] - fVar173;
      fVar179 = pfVar10[1] - fVar174;
      fVar182 = local_1328._4_4_ - fVar175;
      fVar183 = fVar74 - fVar72;
      fVar184 = fVar76 - fVar144;
      fVar185 = fVar88 - fVar149;
      fVar187 = (float)uStack_1320 - fVar48;
      fVar189 = fVar95 - fVar96;
      fVar122 = fVar159 * fVar176 - fVar132 * fVar184;
      fVar128 = fVar160 * fVar179 - fVar140 * fVar185;
      fStack_1290 = fVar161 * fVar182 - fVar142 * fVar187;
      fStack_128c = fVar162 * fVar183 - fVar143 * fVar189;
      fVar168 = fVar133 - fVar98;
      fVar170 = fVar141 - fVar105;
      fVar171 = (float)local_1328 - fVar108;
      fVar172 = fVar69 - fVar70;
      fVar77 = *(float *)(ray + k * 4);
      uStack_1320._4_4_ = *(float *)(ray + k * 4 + 0x10);
      fVar113 = *(float *)(ray + k * 4 + 0x40);
      fVar110 = *(float *)(ray + k * 4 + 0x50);
      local_1278._4_4_ = fVar77;
      local_1278._0_4_ = fVar77;
      fStack_1270 = fVar77;
      fStack_126c = fVar77;
      local_f98 = fVar98 - fVar77;
      fStack_f94 = fVar105 - fVar77;
      fStack_f90 = fVar108 - fVar77;
      fStack_f8c = fVar70 - fVar77;
      fVar173 = fVar173 - uStack_1320._4_4_;
      fVar174 = fVar174 - uStack_1320._4_4_;
      fVar175 = fVar175 - uStack_1320._4_4_;
      fVar72 = fVar72 - uStack_1320._4_4_;
      fVar151 = local_f98 * fVar110 - fVar173 * fVar113;
      fVar155 = fStack_f94 * fVar110 - fVar174 * fVar113;
      fVar157 = fStack_f90 * fVar110 - fVar175 * fVar113;
      fVar158 = fStack_f8c * fVar110 - fVar72 * fVar113;
      fVar98 = fVar98 - fVar177;
      fVar105 = fVar105 - fVar180;
      fVar108 = fVar108 - (float)uStack_12e0;
      fVar70 = fVar70 - uStack_12e0._4_4_;
      local_fa8 = fVar98 * fVar184 - fVar159 * fVar168;
      fStack_fa4 = fVar105 * fVar185 - fVar160 * fVar170;
      fStack_fa0 = fVar108 * fVar187 - fVar161 * fVar171;
      fStack_f9c = fVar70 * fVar189 - fVar162 * fVar172;
      fVar89 = *(float *)(ray + k * 4 + 0x20);
      fStack_1314 = *(float *)(ray + k * 4 + 0x60);
      fVar144 = fVar144 - fVar89;
      fVar149 = fVar149 - fVar89;
      fVar48 = fVar48 - fVar89;
      fVar96 = fVar96 - fVar89;
      fVar75 = fVar144 * fVar113 - local_f98 * fStack_1314;
      fVar87 = fVar149 * fVar113 - fStack_f94 * fStack_1314;
      fVar91 = fVar48 * fVar113 - fStack_f90 * fStack_1314;
      fVar94 = fVar96 * fVar113 - fStack_f8c * fStack_1314;
      fVar163 = fVar132 * fVar168 - fVar98 * fVar176;
      fVar165 = fVar140 * fVar170 - fVar105 * fVar179;
      fVar166 = fVar142 * fVar171 - fVar108 * fVar182;
      fVar167 = fVar143 * fVar172 - fVar70 * fVar183;
      fVar191 = fVar173 * fStack_1314 - fVar144 * fVar110;
      fVar192 = fVar174 * fStack_1314 - fVar149 * fVar110;
      fVar193 = fVar175 * fStack_1314 - fVar48 * fVar110;
      fVar194 = fVar72 * fStack_1314 - fVar96 * fVar110;
      fVar123 = fVar122 * fVar113 + local_fa8 * fVar110 + fVar163 * fStack_1314;
      fVar129 = fVar128 * fVar113 + fStack_fa4 * fVar110 + fVar165 * fStack_1314;
      fVar130 = fStack_1290 * fVar113 + fStack_fa0 * fVar110 + fVar166 * fStack_1314;
      fVar131 = fStack_128c * fVar113 + fStack_f9c * fVar110 + fVar167 * fStack_1314;
      uVar68 = (uint)fVar123 & 0x80000000;
      uVar71 = (uint)fVar129 & 0x80000000;
      uVar73 = (uint)fVar130 & 0x80000000;
      uVar97 = (uint)fVar131 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar168 * fVar191 + fVar176 * fVar75 + fVar184 * fVar151) ^ uVar68
      ;
      tNear.field_0.i[1] = (uint)(fVar170 * fVar192 + fVar179 * fVar87 + fVar185 * fVar155) ^ uVar71
      ;
      tNear.field_0.i[2] = (uint)(fVar171 * fVar193 + fVar182 * fVar91 + fVar187 * fVar157) ^ uVar73
      ;
      tNear.field_0.i[3] = (uint)(fVar172 * fVar194 + fVar183 * fVar94 + fVar189 * fVar158) ^ uVar97
      ;
      fVar75 = (float)((uint)(fVar191 * fVar98 + fVar75 * fVar132 + fVar151 * fVar159) ^ uVar68);
      fVar87 = (float)((uint)(fVar192 * fVar105 + fVar87 * fVar140 + fVar155 * fVar160) ^ uVar71);
      fVar91 = (float)((uint)(fVar193 * fVar108 + fVar91 * fVar142 + fVar157 * fVar161) ^ uVar73);
      fVar94 = (float)((uint)(fVar194 * fVar70 + fVar94 * fVar143 + fVar158 * fVar162) ^ uVar97);
      fVar98 = ABS(fVar123);
      fVar105 = ABS(fVar129);
      fVar108 = ABS(fVar130);
      fVar70 = ABS(fVar131);
      bVar24 = ((0.0 <= fVar75 && 0.0 <= tNear.field_0.v[0]) && fVar123 != 0.0) &&
               tNear.field_0.v[0] + fVar75 <= fVar98;
      auVar153._0_4_ = -(uint)bVar24;
      bVar25 = ((0.0 <= fVar87 && 0.0 <= tNear.field_0.v[1]) && fVar129 != 0.0) &&
               tNear.field_0.v[1] + fVar87 <= fVar105;
      auVar153._4_4_ = -(uint)bVar25;
      bVar23 = ((0.0 <= fVar91 && 0.0 <= tNear.field_0.v[2]) && fVar130 != 0.0) &&
               tNear.field_0.v[2] + fVar91 <= fVar108;
      auVar153._8_4_ = -(uint)bVar23;
      bVar22 = ((0.0 <= fVar94 && 0.0 <= tNear.field_0.v[3]) && fVar131 != 0.0) &&
               tNear.field_0.v[3] + fVar94 <= fVar70;
      auVar153._12_4_ = -(uint)bVar22;
      lVar44 = ((ulong)pRVar46 & 0xfffffffffffffff0) + lVar36;
      uVar49 = movmskps((int)lVar36,auVar153);
      pRVar35 = (RayHitK<4> *)(ulong)uVar49;
      fStack_1280 = fVar89;
      fStack_127c = fVar89;
      if (uVar49 != 0) {
        fVar144 = (float)(uVar68 ^ (uint)(local_f98 * fVar122 +
                                         fVar173 * local_fa8 + fVar144 * fVar163));
        fVar174 = (float)(uVar71 ^ (uint)(fStack_f94 * fVar128 +
                                         fVar174 * fStack_fa4 + fVar149 * fVar165));
        fVar149 = (float)(uVar73 ^ (uint)(fStack_f90 * fStack_1290 +
                                         fVar175 * fStack_fa0 + fVar48 * fVar166));
        fVar175 = (float)(uVar97 ^ (uint)(fStack_f8c * fStack_128c +
                                         fVar72 * fStack_f9c + fVar96 * fVar167));
        fVar173 = *(float *)(ray + k * 4 + 0x30);
        bVar15 = fVar173 * fVar98 < fVar144;
        bVar16 = fVar173 * fVar105 < fVar174;
        bVar17 = fVar173 * fVar108 < fVar149;
        bVar18 = fVar173 * fVar70 < fVar175;
        auVar115._4_4_ = -(uint)bVar16;
        auVar115._0_4_ = -(uint)bVar15;
        auVar115._8_4_ = -(uint)bVar17;
        auVar115._12_4_ = -(uint)bVar18;
        fVar173 = *(float *)(ray + k * 4 + 0x80);
        bVar24 = (fVar144 <= fVar173 * fVar98 && bVar15) && bVar24;
        bVar25 = (fVar174 <= fVar173 * fVar105 && bVar16) && bVar25;
        valid.field_0._0_8_ = CONCAT44(-(uint)bVar25,-(uint)bVar24);
        bVar23 = (fVar149 <= fVar173 * fVar108 && bVar17) && bVar23;
        valid.field_0.i[2] = -(uint)bVar23;
        bVar22 = (fVar175 <= fVar173 * fVar70 && bVar18) && bVar22;
        valid.field_0.i[3] = -(uint)bVar22;
        uVar34 = (undefined4)((ulong)ray >> 0x20);
        iVar32 = movmskps((int)ray,(undefined1  [16])valid.field_0);
        pRVar35 = (RayHitK<4> *)CONCAT44(uVar34,iVar32);
        if (iVar32 != 0) {
          local_1108._4_4_ = fVar128;
          local_1108._0_4_ = fVar122;
          local_1108._8_4_ = fStack_1290;
          local_1108._12_4_ = fStack_128c;
          local_10d8._8_8_ = uStack_fc0;
          local_10d8._0_8_ = local_fc8;
          auVar19._4_4_ = fVar105;
          auVar19._0_4_ = fVar98;
          auVar19._8_4_ = fVar108;
          auVar19._12_4_ = fVar70;
          auVar99 = rcpps(auVar115,auVar19);
          fVar77 = auVar99._0_4_;
          fVar113 = auVar99._4_4_;
          fVar89 = auVar99._8_4_;
          fVar48 = auVar99._12_4_;
          fVar72 = (float)DAT_01f46a60;
          fVar96 = DAT_01f46a60._4_4_;
          fVar122 = DAT_01f46a60._12_4_;
          fVar110 = DAT_01f46a60._8_4_;
          fVar77 = (fVar72 - fVar98 * fVar77) * fVar77 + fVar77;
          fVar113 = (fVar96 - fVar105 * fVar113) * fVar113 + fVar113;
          fVar89 = (fVar110 - fVar108 * fVar89) * fVar89 + fVar89;
          fVar48 = (fVar122 - fVar70 * fVar48) * fVar48 + fVar48;
          fVar144 = fVar144 * fVar77;
          fVar174 = fVar174 * fVar113;
          fVar149 = fVar149 * fVar89;
          fVar175 = fVar175 * fVar48;
          local_1118._4_4_ = fVar174;
          local_1118._0_4_ = fVar144;
          fStack_1110 = fVar149;
          fStack_110c = fVar175;
          auVar169._0_4_ = tNear.field_0.v[0] * fVar77;
          auVar169._4_4_ = tNear.field_0.v[1] * fVar113;
          auVar169._8_4_ = tNear.field_0.v[2] * fVar89;
          auVar169._12_4_ = tNear.field_0.v[3] * fVar48;
          auVar125 = minps(auVar169,_DAT_01f46a60);
          auVar101._0_4_ = fVar77 * fVar75;
          auVar101._4_4_ = fVar113 * fVar87;
          auVar101._8_4_ = fVar89 * fVar91;
          auVar101._12_4_ = fVar48 * fVar94;
          auVar99 = minps(auVar101,_DAT_01f46a60);
          auVar116._0_4_ = fVar72 - auVar125._0_4_;
          auVar116._4_4_ = fVar96 - auVar125._4_4_;
          auVar116._8_4_ = fVar110 - auVar125._8_4_;
          auVar116._12_4_ = fVar122 - auVar125._12_4_;
          auVar126._0_4_ = fVar72 - auVar99._0_4_;
          auVar126._4_4_ = fVar96 - auVar99._4_4_;
          auVar126._8_4_ = fVar110 - auVar99._8_4_;
          auVar126._12_4_ = fVar122 - auVar99._12_4_;
          local_1138 = blendvps(auVar125,auVar116,local_10d8);
          local_1128 = blendvps(auVar99,auVar126,local_10d8);
          local_10f8 = CONCAT44(fStack_fa4,local_fa8);
          uStack_10f0 = CONCAT44(fStack_f9c,fStack_fa0);
          local_10e8 = CONCAT44(fVar165,fVar163);
          uStack_10e0 = CONCAT44(fVar167,fVar166);
          auVar57._8_4_ = valid.field_0.i[2];
          auVar57._0_8_ = valid.field_0._0_8_;
          auVar57._12_4_ = valid.field_0.i[3];
          auVar20._4_4_ = fVar174;
          auVar20._0_4_ = fVar144;
          auVar20._8_4_ = fVar149;
          auVar20._12_4_ = fVar175;
          auVar125 = blendvps(_DAT_01f45a30,auVar20,auVar57);
          auVar117._4_4_ = auVar125._0_4_;
          auVar117._0_4_ = auVar125._4_4_;
          auVar117._8_4_ = auVar125._12_4_;
          auVar117._12_4_ = auVar125._8_4_;
          auVar99 = minps(auVar117,auVar125);
          auVar58._0_8_ = auVar99._8_8_;
          auVar58._8_4_ = auVar99._0_4_;
          auVar58._12_4_ = auVar99._4_4_;
          auVar99 = minps(auVar58,auVar99);
          auVar59._0_8_ =
               CONCAT44(-(uint)(auVar99._4_4_ == auVar125._4_4_ && bVar25),
                        -(uint)(auVar99._0_4_ == auVar125._0_4_ && bVar24));
          auVar59._8_4_ = -(uint)(auVar99._8_4_ == auVar125._8_4_ && bVar23);
          auVar59._12_4_ = -(uint)(auVar99._12_4_ == auVar125._12_4_ && bVar22);
          iVar32 = movmskps(iVar32,auVar59);
          aVar78 = valid.field_0;
          if (iVar32 != 0) {
            aVar78.i[2] = auVar59._8_4_;
            aVar78._0_8_ = auVar59._0_8_;
            aVar78.i[3] = auVar59._12_4_;
          }
          uVar33 = movmskps(iVar32,(undefined1  [16])aVar78);
          uVar47 = CONCAT44(uVar34,uVar33);
          pSVar38 = (Scene *)0x0;
          _local_1278 = ZEXT416((uint)fVar173);
          if (uVar47 != 0) {
            for (; (uVar47 >> (long)pSVar38 & 1) == 0;
                pSVar38 = (Scene *)((long)&(pSVar38->super_AccelN).super_Accel.super_AccelData.
                                           super_RefCount._vptr_RefCount + 1)) {
            }
          }
LAB_007092f1:
          uVar49 = puVar42[(long)pSVar38];
          pGVar13 = (pSVar7->geometries).items[uVar49].ptr;
          if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_12e8 + (long)pSVar38 * 4 + -0x10) = 0;
            pSVar38 = pSVar7;
LAB_0070962e:
            iVar32 = movmskps((int)pSVar38,(undefined1  [16])valid.field_0);
            if (iVar32 == 0) goto LAB_00709e08;
            auVar21._4_4_ = fVar174;
            auVar21._0_4_ = fVar144;
            auVar21._8_4_ = fVar149;
            auVar21._12_4_ = fVar175;
            auVar125 = blendvps(_DAT_01f45a30,auVar21,(undefined1  [16])valid.field_0);
            auVar118._4_4_ = auVar125._0_4_;
            auVar118._0_4_ = auVar125._4_4_;
            auVar118._8_4_ = auVar125._12_4_;
            auVar118._12_4_ = auVar125._8_4_;
            auVar99 = minps(auVar118,auVar125);
            auVar80._0_8_ = auVar99._8_8_;
            auVar80._8_4_ = auVar99._0_4_;
            auVar80._12_4_ = auVar99._4_4_;
            auVar99 = minps(auVar80,auVar99);
            auVar81._0_8_ =
                 CONCAT44(-(uint)(auVar99._4_4_ == auVar125._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar99._0_4_ == auVar125._0_4_) & valid.field_0._0_4_);
            auVar81._8_4_ = -(uint)(auVar99._8_4_ == auVar125._8_4_) & valid.field_0._8_4_;
            auVar81._12_4_ = -(uint)(auVar99._12_4_ == auVar125._12_4_) & valid.field_0._12_4_;
            iVar32 = movmskps(iVar32,auVar81);
            aVar61 = valid.field_0;
            if (iVar32 != 0) {
              aVar61.i[2] = auVar81._8_4_;
              aVar61._0_8_ = auVar81._0_8_;
              aVar61.i[3] = auVar81._12_4_;
            }
            uVar34 = movmskps(iVar32,(undefined1  [16])aVar61);
            uVar47 = CONCAT44((int)((ulong)pSVar38 >> 0x20),uVar34);
            pSVar38 = (Scene *)0x0;
            if (uVar47 != 0) {
              for (; (uVar47 >> (long)pSVar38 & 1) == 0;
                  pSVar38 = (Scene *)((long)&(pSVar38->super_AccelN).super_Accel.super_AccelData.
                                             super_RefCount._vptr_RefCount + 1)) {
              }
            }
            goto LAB_007092f1;
          }
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1038 = *(undefined4 *)(local_1138 + (long)pSVar38 * 4);
            local_1028 = *(undefined4 *)(local_1128 + (long)pSVar38 * 4);
            local_1068._4_4_ = *(undefined4 *)(local_1108 + (long)pSVar38 * 4);
            local_1058._4_4_ = *(undefined4 *)((long)&local_10f8 + (long)pSVar38 * 4);
            local_1008._4_4_ = uVar49;
            local_1008._0_4_ = uVar49;
            local_1008._8_4_ = uVar49;
            local_1008._12_4_ = uVar49;
            local_1298 = (undefined4)lVar44;
            uStack_1294 = (undefined4)((ulong)lVar44 >> 0x20);
            uVar34 = *(undefined4 *)(lVar44 + 0x50 + (long)pSVar38 * 4);
            local_1018._4_4_ = uVar34;
            local_1018._0_4_ = uVar34;
            local_1018._8_4_ = uVar34;
            local_1018._12_4_ = uVar34;
            local_1048._4_4_ = *(undefined4 *)((long)&local_10e8 + (long)pSVar38 * 4);
            local_1068._0_4_ = local_1068._4_4_;
            local_1068._8_4_ = local_1068._4_4_;
            local_1068._12_4_ = local_1068._4_4_;
            local_1058._0_4_ = local_1058._4_4_;
            local_1058._8_4_ = local_1058._4_4_;
            local_1058._12_4_ = local_1058._4_4_;
            local_1048._0_4_ = local_1048._4_4_;
            local_1048._8_4_ = local_1048._4_4_;
            local_1048._12_4_ = local_1048._4_4_;
            uStack_1034 = local_1038;
            uStack_1030 = local_1038;
            uStack_102c = local_1038;
            uStack_1024 = local_1028;
            uStack_1020 = local_1028;
            uStack_101c = local_1028;
            local_ff8 = context->user->instID[0];
            uStack_ff4 = local_ff8;
            uStack_ff0 = local_ff8;
            uStack_fec = local_ff8;
            local_fe8 = context->user->instPrimID[0];
            uStack_fe4 = local_fe8;
            uStack_fe0 = local_fe8;
            uStack_fdc = local_fe8;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + (long)pSVar38 * 4);
            local_12a8 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.valid = (int *)local_12a8;
            args.geometryUserPtr = pGVar13->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1068;
            args.N = 4;
            local_1288 = puVar42;
            args.ray = (RTCRayN *)ray;
            if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar13->intersectionFilterN)(&args);
            }
            if (local_12a8 == (undefined1  [16])0x0) {
              auVar79._8_4_ = 0xffffffff;
              auVar79._0_8_ = 0xffffffffffffffff;
              auVar79._12_4_ = 0xffffffff;
              auVar79 = auVar79 ^ _DAT_01f46b70;
            }
            else {
              p_Var14 = context->args->filter;
              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var14)(&args);
              }
              auVar60._0_4_ = -(uint)(local_12a8._0_4_ == 0);
              auVar60._4_4_ = -(uint)(local_12a8._4_4_ == 0);
              auVar60._8_4_ = -(uint)(local_12a8._8_4_ == 0);
              auVar60._12_4_ = -(uint)(local_12a8._12_4_ == 0);
              auVar79 = auVar60 ^ _DAT_01f46b70;
              if (local_12a8 != (undefined1  [16])0x0) {
                auVar99 = blendvps(*(undefined1 (*) [16])args.hit,
                                   *(undefined1 (*) [16])(args.ray + 0xc0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                   *(undefined1 (*) [16])(args.ray + 0xd0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                   *(undefined1 (*) [16])(args.ray + 0xe0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                   *(undefined1 (*) [16])(args.ray + 0xf0),auVar60);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                   *(undefined1 (*) [16])(args.ray + 0x100),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                   *(undefined1 (*) [16])(args.ray + 0x110),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                   *(undefined1 (*) [16])(args.ray + 0x120),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                   *(undefined1 (*) [16])(args.ray + 0x130),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar99;
                auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                   *(undefined1 (*) [16])(args.ray + 0x140),auVar60);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar99;
              }
            }
            if ((_DAT_01f46b40 & auVar79) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1278._0_4_;
            }
            else {
              _local_1278 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_12e8 + (long)pSVar38 * 4 + -0x10) = 0;
            valid.field_0.i[0] = -(uint)(fVar144 <= (float)local_1278._0_4_) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar174 <= (float)local_1278._0_4_) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar149 <= (float)local_1278._0_4_) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar175 <= (float)local_1278._0_4_) & valid.field_0.i[3];
            lVar44 = CONCAT44(uStack_1294,local_1298);
            puVar42 = local_1288;
            goto LAB_0070962e;
          }
          uVar34 = *(undefined4 *)(local_1138 + (long)pSVar38 * 4);
          uVar33 = *(undefined4 *)(local_1128 + (long)pSVar38 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + (long)pSVar38 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1108 + (long)pSVar38 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) =
               *(undefined4 *)((long)&local_10f8 + (long)pSVar38 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) =
               *(undefined4 *)((long)&local_10e8 + (long)pSVar38 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar34;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar33;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar44 + 0x50 + (long)pSVar38 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar49;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_00709e08:
          fVar77 = *(float *)(ray + k * 4);
          uStack_1320._4_4_ = *(float *)(ray + k * 4 + 0x10);
          fVar89 = *(float *)(ray + k * 4 + 0x20);
          fVar113 = *(float *)(ray + k * 4 + 0x40);
          fVar110 = *(float *)(ray + k * 4 + 0x50);
          fStack_1314 = *(float *)(ray + k * 4 + 0x60);
          pRVar35 = ray;
        }
      }
      fVar133 = fVar92 - fVar133;
      fVar141 = fVar109 - fVar141;
      fStack_11f0 = fStack_12d0 - fStack_11f0;
      fStack_11ec = fStack_12cc - fStack_11ec;
      fVar98 = fVar152 - (float)local_1328;
      fVar69 = fVar156 - fVar69;
      fVar173 = fStack_12c4 - local_1328._4_4_;
      fVar74 = fVar111 - fVar74;
      fStack_12c0 = (float)uVar26;
      fStack_12bc = (float)((ulong)uVar26 >> 0x20);
      fVar76 = fVar164 - fVar76;
      fVar88 = fVar106 - fVar88;
      fVar144 = fStack_12c0 - (float)uStack_1320;
      fVar95 = fStack_12bc - fVar95;
      fVar177 = fVar177 - fVar92;
      fVar180 = fVar180 - fVar109;
      fVar130 = (float)uStack_12e0 - fStack_12d0;
      fVar131 = uStack_12e0._4_4_ - fStack_12cc;
      fVar75 = local_f88 - fVar152;
      fVar87 = fStack_f84 - fVar156;
      fVar91 = fStack_f80 - fStack_12c4;
      fVar94 = fStack_f7c - fVar111;
      fVar178 = fVar178 - fVar164;
      fVar181 = fVar181 - fVar106;
      fVar67 = fVar67 - fStack_12c0;
      fVar103 = fVar103 - fStack_12bc;
      local_12e8._0_4_ = fVar75 * fVar76 - fVar178 * fVar98;
      local_12e8._4_4_ = fVar87 * fVar88 - fVar181 * fVar69;
      uStack_12e0._0_4_ = fVar91 * fVar144 - fVar67 * fVar173;
      uStack_12e0._4_4_ = fVar94 * fVar95 - fVar103 * fVar74;
      fVar132 = fVar178 * fVar133 - fVar177 * fVar76;
      fVar140 = fVar181 * fVar141 - fVar180 * fVar88;
      fVar142 = fVar67 * fStack_11f0 - fVar130 * fVar144;
      fVar143 = fVar103 * fStack_11ec - fVar131 * fVar95;
      fVar72 = fVar177 * fVar98 - fVar75 * fVar133;
      fVar96 = fVar180 * fVar69 - fVar87 * fVar141;
      auVar139._0_8_ = CONCAT44(fVar96,fVar72);
      auVar139._8_4_ = fVar130 * fVar173 - fVar91 * fStack_11f0;
      auVar139._12_4_ = fVar131 * fVar74 - fVar94 * fStack_11ec;
      local_12d8._0_4_ = fVar92 - fVar77;
      local_12d8._4_4_ = fVar109 - fVar77;
      fStack_12d0 = fStack_12d0 - fVar77;
      fStack_12cc = fStack_12cc - fVar77;
      fVar152 = fVar152 - uStack_1320._4_4_;
      fVar156 = fVar156 - uStack_1320._4_4_;
      fStack_12c4 = fStack_12c4 - uStack_1320._4_4_;
      fVar111 = fVar111 - uStack_1320._4_4_;
      fVar164 = fVar164 - fVar89;
      fVar106 = fVar106 - fVar89;
      fStack_12c0 = fStack_12c0 - fVar89;
      fStack_12bc = fStack_12bc - fVar89;
      fVar108 = fVar152 * fStack_1314 - fVar164 * fVar110;
      fVar175 = fVar156 * fStack_1314 - fVar106 * fVar110;
      fVar48 = fStack_12c4 * fStack_1314 - fStack_12c0 * fVar110;
      fVar70 = fVar111 * fStack_1314 - fStack_12bc * fVar110;
      fVar122 = fVar164 * fVar113 - (float)local_12d8._0_4_ * fStack_1314;
      fVar123 = fVar106 * fVar113 - (float)local_12d8._4_4_ * fStack_1314;
      fVar128 = fStack_12c0 * fVar113 - fStack_12d0 * fStack_1314;
      fVar129 = fStack_12bc * fVar113 - fStack_12cc * fStack_1314;
      fVar77 = (float)local_12d8._0_4_ * fVar110 - fVar152 * fVar113;
      fVar89 = (float)local_12d8._4_4_ * fVar110 - fVar156 * fVar113;
      fVar92 = fStack_12d0 * fVar110 - fStack_12c4 * fVar113;
      fVar105 = fStack_12cc * fVar110 - fVar111 * fVar113;
      local_1328 = CONCAT44(fVar140,fVar132);
      uStack_1320 = CONCAT44(fVar143,fVar142);
      fVar174 = fVar113 * (float)local_12e8._0_4_ + fVar110 * fVar132 + fStack_1314 * fVar72;
      fVar149 = fVar113 * (float)local_12e8._4_4_ + fVar110 * fVar140 + fStack_1314 * fVar96;
      fVar109 = fVar113 * (float)uStack_12e0 + fVar110 * fVar142 + fStack_1314 * auVar139._8_4_;
      fVar113 = fVar113 * uStack_12e0._4_4_ + fVar110 * fVar143 + fStack_1314 * auVar139._12_4_;
      uVar49 = (uint)fVar174 & 0x80000000;
      uVar68 = (uint)fVar149 & 0x80000000;
      uVar71 = (uint)fVar109 & 0x80000000;
      uVar73 = (uint)fVar113 & 0x80000000;
      tNear.field_0.i[0] = (uint)(fVar177 * fVar108 + fVar75 * fVar122 + fVar178 * fVar77) ^ uVar49;
      tNear.field_0.i[1] = (uint)(fVar180 * fVar175 + fVar87 * fVar123 + fVar181 * fVar89) ^ uVar68;
      tNear.field_0.i[2] = (uint)(fVar130 * fVar48 + fVar91 * fVar128 + fVar67 * fVar92) ^ uVar71;
      tNear.field_0.i[3] = (uint)(fVar131 * fVar70 + fVar94 * fVar129 + fVar103 * fVar105) ^ uVar73;
      fVar77 = (float)((uint)(fVar108 * fVar133 + fVar122 * fVar98 + fVar77 * fVar76) ^ uVar49);
      fVar141 = (float)((uint)(fVar175 * fVar141 + fVar123 * fVar69 + fVar89 * fVar88) ^ uVar68);
      fVar48 = (float)((uint)(fVar48 * fStack_11f0 + fVar128 * fVar173 + fVar92 * fVar144) ^ uVar71)
      ;
      fVar67 = (float)((uint)(fVar70 * fStack_11ec + fVar129 * fVar74 + fVar105 * fVar95) ^ uVar73);
      fVar70 = ABS(fVar174);
      fVar103 = ABS(fVar149);
      auVar147._0_8_ = CONCAT44(fVar149,fVar174) & 0x7fffffff7fffffff;
      auVar147._8_4_ = ABS(fVar109);
      auVar147._12_4_ = ABS(fVar113);
      bVar24 = tNear.field_0.v[0] + fVar77 <= fVar70 &&
               ((0.0 <= fVar77 && 0.0 <= tNear.field_0.v[0]) && fVar174 != 0.0);
      auVar56._0_4_ = -(uint)bVar24;
      bVar25 = tNear.field_0.v[1] + fVar141 <= fVar103 &&
               ((0.0 <= fVar141 && 0.0 <= tNear.field_0.v[1]) && fVar149 != 0.0);
      auVar56._4_4_ = -(uint)bVar25;
      bVar23 = tNear.field_0.v[2] + fVar48 <= auVar147._8_4_ &&
               ((0.0 <= fVar48 && 0.0 <= tNear.field_0.v[2]) && fVar109 != 0.0);
      auVar56._8_4_ = -(uint)bVar23;
      bVar22 = tNear.field_0.v[3] + fVar67 <= auVar147._12_4_ &&
               ((0.0 <= fVar67 && 0.0 <= tNear.field_0.v[3]) && fVar113 != 0.0);
      auVar56._12_4_ = -(uint)bVar22;
      iVar31 = movmskps((int)pRVar35,auVar56);
      fVar113 = local_1078;
      fVar144 = fStack_1074;
      fVar177 = fStack_1070;
      fVar178 = fStack_106c;
      fVar110 = local_1088;
      fVar92 = fStack_1084;
      fVar133 = fStack_1080;
      fVar76 = fStack_107c;
      fVar98 = local_10a8;
      fVar105 = fStack_10a4;
      fVar174 = fStack_10a0;
      fVar149 = fStack_109c;
      fVar173 = local_10b8;
      fVar180 = fStack_10b4;
      fVar181 = fStack_10b0;
      fVar109 = fStack_10ac;
      iVar32 = local_10c8;
      iVar186 = iStack_10c4;
      iVar188 = iStack_10c0;
      iVar190 = iStack_10bc;
      fVar89 = local_1098;
      fVar88 = fStack_1094;
      fVar108 = fStack_1090;
      fVar175 = fStack_108c;
      if (iVar31 != 0) {
        fVar72 = (float)(uVar49 ^ (uint)((float)local_12d8._0_4_ * (float)local_12e8._0_4_ +
                                        fVar152 * fVar132 + fVar164 * fVar72));
        fVar96 = (float)(uVar68 ^ (uint)((float)local_12d8._4_4_ * (float)local_12e8._4_4_ +
                                        fVar156 * fVar140 + fVar106 * fVar96));
        fVar106 = (float)(uVar71 ^ (uint)(fStack_12d0 * (float)uStack_12e0 +
                                         fStack_12c4 * fVar142 + fStack_12c0 * auVar139._8_4_));
        fVar111 = (float)(uVar73 ^ (uint)(fStack_12cc * uStack_12e0._4_4_ +
                                         fVar111 * fVar143 + fStack_12bc * auVar139._12_4_));
        fVar152 = *(float *)(ray + k * 4 + 0x30);
        fVar156 = *(float *)(ray + k * 4 + 0x80);
        auVar99 = ZEXT416((uint)fVar156);
        auVar154._0_4_ = fVar156 * fVar70;
        auVar154._4_4_ = fVar156 * fVar103;
        auVar154._8_4_ = fVar156 * auVar147._8_4_;
        auVar154._12_4_ = fVar156 * auVar147._12_4_;
        bVar24 = (fVar72 <= auVar154._0_4_ && fVar152 * fVar70 < fVar72) && bVar24;
        bVar25 = (fVar96 <= auVar154._4_4_ && fVar152 * fVar103 < fVar96) && bVar25;
        valid.field_0._0_8_ = CONCAT44(-(uint)bVar25,-(uint)bVar24);
        bVar23 = (fVar106 <= auVar154._8_4_ && fVar152 * auVar147._8_4_ < fVar106) && bVar23;
        valid.field_0.i[2] = -(uint)bVar23;
        bVar22 = (fVar111 <= auVar154._12_4_ && fVar152 * auVar147._12_4_ < fVar111) && bVar22;
        valid.field_0.i[3] = -(uint)bVar22;
        iVar31 = movmskps((int)ray,(undefined1  [16])valid.field_0);
        if (iVar31 != 0) {
          uStack_1230 = auVar139._8_8_;
          local_10d8._8_8_ = uStack_fd0;
          local_10d8._0_8_ = local_fd8;
          pSVar7 = context->scene;
          auVar125 = rcpps(auVar154,auVar147);
          fVar152 = auVar125._0_4_;
          fVar156 = auVar125._4_4_;
          fVar74 = auVar125._8_4_;
          fVar95 = auVar125._12_4_;
          fVar164 = (float)DAT_01f46a60;
          fVar75 = DAT_01f46a60._4_4_;
          fVar87 = DAT_01f46a60._12_4_;
          fVar69 = DAT_01f46a60._8_4_;
          fVar152 = (fVar164 - fVar70 * fVar152) * fVar152 + fVar152;
          fVar156 = (fVar75 - fVar103 * fVar156) * fVar156 + fVar156;
          fVar74 = (fVar69 - auVar147._8_4_ * fVar74) * fVar74 + fVar74;
          fVar95 = (fVar87 - auVar147._12_4_ * fVar95) * fVar95 + fVar95;
          auVar150._0_4_ = fVar72 * fVar152;
          auVar150._4_4_ = fVar96 * fVar156;
          auVar150._8_4_ = fVar106 * fVar74;
          auVar150._12_4_ = fVar111 * fVar95;
          _local_1118 = auVar150;
          auVar82._0_4_ = tNear.field_0.v[0] * fVar152;
          auVar82._4_4_ = tNear.field_0.v[1] * fVar156;
          auVar82._8_4_ = tNear.field_0.v[2] * fVar74;
          auVar82._12_4_ = tNear.field_0.v[3] * fVar95;
          auVar125 = minps(auVar82,_DAT_01f46a60);
          auVar127._0_4_ = fVar152 * fVar77;
          auVar127._4_4_ = fVar156 * fVar141;
          auVar127._8_4_ = fVar74 * fVar48;
          auVar127._12_4_ = fVar95 * fVar67;
          auVar136 = minps(auVar127,_DAT_01f46a60);
          auVar148._8_4_ = valid.field_0.i[2];
          auVar148._0_8_ = valid.field_0._0_8_;
          auVar148._12_4_ = valid.field_0.i[3];
          auVar102._0_4_ = fVar164 - auVar125._0_4_;
          auVar102._4_4_ = fVar75 - auVar125._4_4_;
          auVar102._8_4_ = fVar69 - auVar125._8_4_;
          auVar102._12_4_ = fVar87 - auVar125._12_4_;
          auVar119._0_4_ = fVar164 - auVar136._0_4_;
          auVar119._4_4_ = fVar75 - auVar136._4_4_;
          auVar119._8_4_ = fVar69 - auVar136._8_4_;
          auVar119._12_4_ = fVar87 - auVar136._12_4_;
          local_1138 = blendvps(auVar125,auVar102,local_10d8);
          local_1128 = blendvps(auVar136,auVar119,local_10d8);
          local_1108._8_8_ = uStack_12e0;
          local_1108._0_8_ = local_12e8;
          local_10f8 = local_1328;
          uStack_10f0 = uStack_1320;
          local_10e8 = auVar139._0_8_;
          uStack_10e0 = uStack_1230;
          auVar62._8_4_ = valid.field_0.i[2];
          auVar62._0_8_ = valid.field_0._0_8_;
          auVar62._12_4_ = valid.field_0.i[3];
          auVar136 = blendvps(_DAT_01f45a30,auVar150,auVar62);
          auVar120._4_4_ = auVar136._0_4_;
          auVar120._0_4_ = auVar136._4_4_;
          auVar120._8_4_ = auVar136._12_4_;
          auVar120._12_4_ = auVar136._8_4_;
          auVar125 = minps(auVar120,auVar136);
          auVar63._0_8_ = auVar125._8_8_;
          auVar63._8_4_ = auVar125._0_4_;
          auVar63._12_4_ = auVar125._4_4_;
          auVar125 = minps(auVar63,auVar125);
          auVar64._0_8_ =
               CONCAT44(-(uint)(auVar125._4_4_ == auVar136._4_4_ && bVar25),
                        -(uint)(auVar125._0_4_ == auVar136._0_4_ && bVar24));
          auVar64._8_4_ = -(uint)(auVar125._8_4_ == auVar136._8_4_ && bVar23);
          auVar64._12_4_ = -(uint)(auVar125._12_4_ == auVar136._12_4_ && bVar22);
          iVar31 = movmskps((int)context,auVar64);
          if (iVar31 != 0) {
            auVar148._8_4_ = auVar64._8_4_;
            auVar148._0_8_ = auVar64._0_8_;
            auVar148._12_4_ = auVar64._12_4_;
          }
          uVar34 = movmskps(iVar31,auVar148);
          uVar39 = CONCAT44((int)((ulong)context >> 0x20),uVar34);
          uVar47 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
            }
          }
LAB_007098fa:
          uVar49 = puVar42[uVar47];
          uVar39 = (ulong)uVar49;
          pGVar13 = (pSVar7->geometries).items[uVar39].ptr;
          if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_12e8 + uVar47 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar34 = *(undefined4 *)(local_1138 + uVar47 * 4);
              uVar33 = *(undefined4 *)(local_1128 + uVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + uVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1108 + uVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_10f8 + uVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_10e8 + uVar47 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar34;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar33;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar44 + 0x50 + uVar47 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar49;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_007090f8;
            }
            local_1038 = *(undefined4 *)(local_1138 + uVar47 * 4);
            local_1028 = *(undefined4 *)(local_1128 + uVar47 * 4);
            uVar34 = *(undefined4 *)(local_1108 + uVar47 * 4);
            uVar33 = *(undefined4 *)((long)&local_10f8 + uVar47 * 4);
            local_1008._4_4_ = uVar49;
            local_1008._0_4_ = uVar49;
            local_1008._8_4_ = uVar49;
            local_1008._12_4_ = uVar49;
            local_1298 = (undefined4)lVar44;
            uStack_1294 = (undefined4)((ulong)lVar44 >> 0x20);
            local_1018._4_4_ = *(undefined4 *)(lVar44 + 0x50 + uVar47 * 4);
            local_1068._4_4_ = uVar34;
            local_1068._0_4_ = uVar34;
            local_1068._8_4_ = uVar34;
            local_1068._12_4_ = uVar34;
            local_1058._4_4_ = uVar33;
            local_1058._0_4_ = uVar33;
            local_1058._8_4_ = uVar33;
            local_1058._12_4_ = uVar33;
            uVar34 = *(undefined4 *)((long)&local_10e8 + uVar47 * 4);
            local_1048._4_4_ = uVar34;
            local_1048._0_4_ = uVar34;
            local_1048._8_4_ = uVar34;
            local_1048._12_4_ = uVar34;
            uStack_1034 = local_1038;
            uStack_1030 = local_1038;
            uStack_102c = local_1038;
            uStack_1024 = local_1028;
            uStack_1020 = local_1028;
            uStack_101c = local_1028;
            local_1018._0_4_ = local_1018._4_4_;
            local_1018._8_4_ = local_1018._4_4_;
            local_1018._12_4_ = local_1018._4_4_;
            local_ff8 = context->user->instID[0];
            uStack_ff4 = local_ff8;
            uStack_ff0 = local_ff8;
            uStack_fec = local_ff8;
            local_fe8 = context->user->instPrimID[0];
            uStack_fe4 = local_fe8;
            uStack_fe0 = local_fe8;
            uStack_fdc = local_fe8;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1118 + uVar47 * 4);
            local_12a8 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
            args.valid = (int *)local_12a8;
            args.geometryUserPtr = pGVar13->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1068;
            args.N = 4;
            local_1288 = puVar42;
            args.ray = (RTCRayN *)ray;
            if (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar13->intersectionFilterN)(&args);
            }
            if (local_12a8 == (undefined1  [16])0x0) {
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = auVar83 ^ _DAT_01f46b70;
            }
            else {
              p_Var14 = context->args->filter;
              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var14)(&args);
              }
              auVar65._0_4_ = -(uint)(local_12a8._0_4_ == 0);
              auVar65._4_4_ = -(uint)(local_12a8._4_4_ == 0);
              auVar65._8_4_ = -(uint)(local_12a8._8_4_ == 0);
              auVar65._12_4_ = -(uint)(local_12a8._12_4_ == 0);
              auVar83 = auVar65 ^ _DAT_01f46b70;
              if (local_12a8 != (undefined1  [16])0x0) {
                auVar125 = blendvps(*(undefined1 (*) [16])args.hit,
                                    *(undefined1 (*) [16])(args.ray + 0xc0),auVar65);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                    *(undefined1 (*) [16])(args.ray + 0xd0),auVar65);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                    *(undefined1 (*) [16])(args.ray + 0xe0),auVar65);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                    *(undefined1 (*) [16])(args.ray + 0xf0),auVar65);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                    *(undefined1 (*) [16])(args.ray + 0x100),auVar65);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                    *(undefined1 (*) [16])(args.ray + 0x110),auVar65);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                    *(undefined1 (*) [16])(args.ray + 0x120),auVar65);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                    *(undefined1 (*) [16])(args.ray + 0x130),auVar65);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar125;
                auVar125 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                    *(undefined1 (*) [16])(args.ray + 0x140),auVar65);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar125;
              }
            }
            if ((_DAT_01f46b40 & auVar83) == (undefined1  [16])0x0) {
              local_12d8._0_4_ = auVar99._0_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = local_12d8._0_4_;
              _local_12d8 = auVar99;
            }
            else {
              _local_12d8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_12e8 + uVar47 * 4 + -0x10) = 0;
            fVar77 = local_12d8._0_4_;
            valid.field_0.i[0] = -(uint)(auVar150._0_4_ <= fVar77) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(auVar150._4_4_ <= fVar77) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(auVar150._8_4_ <= fVar77) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(auVar150._12_4_ <= fVar77) & valid.field_0.i[3];
            lVar44 = CONCAT44(uStack_1294,local_1298);
            uVar39 = uVar47;
            puVar42 = local_1288;
            auVar99 = _local_12d8;
            fVar113 = local_1078;
            fVar144 = fStack_1074;
            fVar177 = fStack_1070;
            fVar178 = fStack_106c;
            fVar110 = local_1088;
            fVar92 = fStack_1084;
            fVar133 = fStack_1080;
            fVar76 = fStack_107c;
            fVar98 = local_10a8;
            fVar105 = fStack_10a4;
            fVar174 = fStack_10a0;
            fVar149 = fStack_109c;
            fVar173 = local_10b8;
            fVar180 = fStack_10b4;
            fVar181 = fStack_10b0;
            fVar109 = fStack_10ac;
            iVar32 = local_10c8;
            iVar186 = iStack_10c4;
            iVar188 = iStack_10c0;
            iVar190 = iStack_10bc;
            fVar89 = local_1098;
            fVar88 = fStack_1094;
            fVar108 = fStack_1090;
            fVar175 = fStack_108c;
            _local_12e8 = auVar150;
          }
          iVar31 = movmskps((int)uVar39,(undefined1  [16])valid.field_0);
          if (iVar31 == 0) goto LAB_007090f8;
          auVar136 = blendvps(_DAT_01f45a30,auVar150,(undefined1  [16])valid.field_0);
          auVar121._4_4_ = auVar136._0_4_;
          auVar121._0_4_ = auVar136._4_4_;
          auVar121._8_4_ = auVar136._12_4_;
          auVar121._12_4_ = auVar136._8_4_;
          auVar125 = minps(auVar121,auVar136);
          auVar84._0_8_ = auVar125._8_8_;
          auVar84._8_4_ = auVar125._0_4_;
          auVar84._12_4_ = auVar125._4_4_;
          auVar125 = minps(auVar84,auVar125);
          auVar85._0_8_ =
               CONCAT44(-(uint)(auVar125._4_4_ == auVar136._4_4_) & valid.field_0._4_4_,
                        -(uint)(auVar125._0_4_ == auVar136._0_4_) & valid.field_0._0_4_);
          auVar85._8_4_ = -(uint)(auVar125._8_4_ == auVar136._8_4_) & valid.field_0._8_4_;
          auVar85._12_4_ = -(uint)(auVar125._12_4_ == auVar136._12_4_) & valid.field_0._12_4_;
          iVar31 = movmskps(iVar31,auVar85);
          aVar66 = valid.field_0;
          if (iVar31 != 0) {
            aVar66.i[2] = auVar85._8_4_;
            aVar66._0_8_ = auVar85._0_8_;
            aVar66.i[3] = auVar85._12_4_;
          }
          uVar34 = movmskps(iVar31,(undefined1  [16])aVar66);
          uVar39 = CONCAT44((int)(uVar39 >> 0x20),uVar34);
          uVar47 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
            }
          }
          goto LAB_007098fa;
        }
      }
LAB_007090f8:
      fVar77 = local_fb8;
      fVar152 = fStack_fb4;
      fVar156 = fStack_fb0;
      fVar141 = fStack_fac;
    }
    iVar31 = *(int *)(ray + k * 4 + 0x80);
    iVar86 = iVar31;
    iVar90 = iVar31;
    iVar93 = iVar31;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }